

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

word * makeArrayB(word **a,int nFuncs)

{
  word *pwVar1;
  ulong uVar2;
  ulong uVar3;
  
  pwVar1 = (word *)malloc((long)nFuncs * 8);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nFuncs;
  if (nFuncs < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pwVar1[uVar2] = *a[uVar2];
  }
  return pwVar1;
}

Assistant:

word* makeArrayB(word** a, int nFuncs)
{
    int i;
    word* b;
    b = (word*)malloc(sizeof(word)*(nFuncs));
    for(i=0;i<nFuncs;i++)
        b[i] = a[i][0];

    return b;
}